

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

int map_insert(map m,map_key key,map_value value)

{
  int iVar1;
  hash hVar2;
  size_t line;
  char *message;
  
  if ((key == (map_key)0x0 || m == (map)0x0) || value == (map_value)0x0) {
    message = "Invalid map insertion parameters";
    line = 0xc3;
  }
  else {
    hVar2 = (*m->hash_cb)(key);
    iVar1 = bucket_insert(m->buckets + hVar2 % m->capacity,key,value);
    if (iVar1 == 0) {
      m->count = m->count + 1;
      iVar1 = map_bucket_realloc(m);
      return iVar1;
    }
    message = "Invalid map bucket insertion";
    line = 0xcf;
  }
  log_write_impl_va("metacall",line,"map_insert",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                    ,LOG_LEVEL_ERROR,message);
  return 1;
}

Assistant:

int map_insert(map m, map_key key, map_value value)
{
	map_hash h;
	size_t index;
	bucket b;

	if (m == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	if (bucket_insert(b, key, value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket insertion");
		return 1;
	}

	++m->count;

	return map_bucket_realloc(m);
}